

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

void __thiscall
QPlainTextDocumentLayout::documentChanged
          (QPlainTextDocumentLayout *this,int from,int charsRemoved,int charsAdded)

{
  qreal qVar1;
  qreal qVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  QPlainTextDocumentLayoutPrivate *pQVar9;
  QTextBlock *block_00;
  ulong uVar10;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  QSizeF *in_RDI;
  long in_FS_OFFSET;
  int oldChangeEnd;
  int blockDiff;
  int changeEnd;
  bool blockVisibilityChanged;
  int charsChanged;
  int newBlockCount;
  QTextDocument *doc;
  QPlainTextDocumentLayoutPrivate *d;
  QRectF newBr;
  QRectF oldBr;
  QTextBlock b;
  QTextBlock block_1;
  QTextBlock block;
  QTextBlock changeEndBlock;
  QTextBlock changeStartBlock;
  QTextBlock *in_stack_ffffffffffffff10;
  QPlainTextDocumentLayout *in_stack_ffffffffffffff18;
  QRectF local_d0;
  QRectF local_b0;
  int local_90 [2];
  QTextBlock local_88;
  undefined1 local_78 [32];
  QTextBlock local_58;
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar9 = d_func((QPlainTextDocumentLayout *)0x6be9bc);
  block_00 = (QTextBlock *)QAbstractTextDocumentLayout::document();
  iVar5 = QTextDocument::blockCount();
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextDocument::findBlock((int)local_18);
  local_28._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_28._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_90[1] = 0;
  local_90[0] = in_ESI + in_EDX + in_ECX + -1;
  qMax<int>(local_90 + 1,local_90);
  QTextDocument::findBlock((int)local_28);
  bVar4 = false;
  bVar3 = QTextBlock::operator==((QTextBlock *)local_18,(QTextBlock *)local_28);
  if ((bVar3) && (iVar5 == pQVar9->blockCount)) {
    local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextBlock::QTextBlock((QTextBlock *)local_38,(QTextBlock *)local_18);
    uVar10 = QTextBlock::isValid();
    if (((uVar10 & 1) != 0) && (iVar6 = QTextBlock::length(), iVar6 != 0)) {
      local_b0.xp = -NAN;
      local_b0.yp = -NAN;
      local_b0.w = -NAN;
      local_b0.h = -NAN;
      (**(code **)((long)in_RDI->wd + 0x88))(&local_b0,in_RDI,local_38);
      layoutBlock(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      local_d0.xp = -NAN;
      local_d0.yp = -NAN;
      local_d0.w = -NAN;
      local_d0.h = -NAN;
      (**(code **)((long)in_RDI->wd + 0x88))(&local_d0,in_RDI,local_38);
      qVar2 = QRectF::height(&local_d0);
      qVar1 = QRectF::height(&local_b0);
      if ((qVar2 == qVar1) && (!NAN(qVar2) && !NAN(qVar1))) {
        if ((pQVar9->blockUpdate & 1U) == 0) {
          QAbstractTextDocumentLayout::updateBlock((QTextBlock *)in_RDI);
        }
        goto LAB_006bef5a;
      }
    }
  }
  else {
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QTextBlock::QTextBlock((QTextBlock *)local_48,(QTextBlock *)local_18);
    do {
      QTextBlock::clearLayout();
      uVar10 = QTextBlock::isVisible();
      if ((uVar10 & 1) == 0) {
        iVar6 = QTextBlock::lineCount();
        if (0 < iVar6) {
LAB_006becbd:
          bVar4 = true;
          QTextBlock::isVisible();
          QTextBlock::setLineCount((int)local_48);
        }
      }
      else {
        iVar6 = QTextBlock::lineCount();
        if (iVar6 == 0) goto LAB_006becbd;
      }
      bVar3 = QTextBlock::operator==((QTextBlock *)local_48,(QTextBlock *)local_28);
      if (bVar3) break;
      QTextBlock::next();
      QTextBlock::operator=((QTextBlock *)local_48,&local_58);
      uVar10 = QTextBlock::isValid();
    } while ((uVar10 & 1) != 0);
  }
  if ((iVar5 != pQVar9->blockCount) || (bVar4)) {
    iVar6 = QTextBlock::blockNumber();
    iVar7 = iVar5 - pQVar9->blockCount;
    iVar8 = iVar6 - iVar7;
    if (iVar8 < pQVar9->maximumWidthBlockNumber) {
      pQVar9->maximumWidthBlockNumber = iVar7 + pQVar9->maximumWidthBlockNumber;
    }
    pQVar9->blockCount = iVar5;
    if (pQVar9->blockCount == 1) {
      QTextDocument::firstBlock();
      qVar2 = blockWidth((QPlainTextDocumentLayout *)CONCAT44(iVar7,iVar8),block_00);
      pQVar9->maximumWidth = qVar2;
    }
    if ((pQVar9->blockDocumentSizeChanged & 1U) == 0) {
      (**(code **)((long)in_RDI->wd + 0x78))();
      QAbstractTextDocumentLayout::documentSizeChanged(in_RDI);
    }
    if ((iVar7 == 1) && (iVar6 == iVar5 + -1)) {
      if ((pQVar9->blockUpdate & 1U) == 0) {
        local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        QTextBlock::QTextBlock((QTextBlock *)local_78,(QTextBlock *)local_18);
        while( true ) {
          QAbstractTextDocumentLayout::updateBlock((QTextBlock *)in_RDI);
          bVar4 = QTextBlock::operator==((QTextBlock *)local_78,(QTextBlock *)local_28);
          if (bVar4) break;
          QTextBlock::next();
          QTextBlock::operator=((QTextBlock *)local_78,&local_88);
        }
      }
      goto LAB_006bef5a;
    }
  }
  if ((pQVar9->blockUpdate & 1U) == 0) {
    qVar2 = (qreal)QTextDocument::documentMargin();
    QRectF::QRectF((QRectF *)&stack0xffffffffffffff00,0.0,-qVar2,1000000000.0,1000000000.0);
    QAbstractTextDocumentLayout::update((QRectF *)in_RDI);
  }
LAB_006bef5a:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPlainTextDocumentLayout::documentChanged(int from, int charsRemoved, int charsAdded)
{
    Q_D(QPlainTextDocumentLayout);
    QTextDocument *doc = document();
    int newBlockCount = doc->blockCount();
    int charsChanged = charsRemoved + charsAdded;

    QTextBlock changeStartBlock = doc->findBlock(from);
    QTextBlock changeEndBlock = doc->findBlock(qMax(0, from + charsChanged - 1));
    bool blockVisibilityChanged = false;

    if (changeStartBlock == changeEndBlock && newBlockCount == d->blockCount) {
        QTextBlock block = changeStartBlock;
        if (block.isValid() && block.length()) {
            QRectF oldBr = blockBoundingRect(block);
            layoutBlock(block);
            QRectF newBr = blockBoundingRect(block);
            if (newBr.height() == oldBr.height()) {
                if (!d->blockUpdate)
                    emit updateBlock(block);
                return;
            }
        }
    } else {
        QTextBlock block = changeStartBlock;
        do {
            block.clearLayout();
            if (block.isVisible()
                    ? (block.lineCount() == 0)
                    : (block.lineCount() > 0)) {
                blockVisibilityChanged = true;
                block.setLineCount(block.isVisible() ? 1 : 0);
            }
            if (block == changeEndBlock)
                break;
            block = block.next();
        } while(block.isValid());
    }

    if (newBlockCount != d->blockCount || blockVisibilityChanged) {
        int changeEnd = changeEndBlock.blockNumber();
        int blockDiff = newBlockCount - d->blockCount;
        int oldChangeEnd = changeEnd - blockDiff;

        if (d->maximumWidthBlockNumber > oldChangeEnd)
            d->maximumWidthBlockNumber += blockDiff;

        d->blockCount = newBlockCount;
        if (d->blockCount == 1)
            d->maximumWidth = blockWidth(doc->firstBlock());

        if (!d->blockDocumentSizeChanged)
            emit documentSizeChanged(documentSize());

        if (blockDiff == 1 && changeEnd == newBlockCount -1 ) {
            if (!d->blockUpdate) {
                QTextBlock b = changeStartBlock;
                for(;;) {
                    emit updateBlock(b);
                    if (b == changeEndBlock)
                        break;
                    b = b.next();
                }
            }
            return;
        }
    }

    if (!d->blockUpdate)
        emit update(QRectF(0., -doc->documentMargin(), 1000000000., 1000000000.)); // optimization potential
}